

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tensor.hpp
# Opt level: O3

void scp::_scp::cooleyTukey<std::complex<double>>
               (complex<double> *beg,uint64_t stride,complex<double> *base,uint64_t baseStride,
               uint64_t size,pair<unsigned_long,_unsigned_long> *factors,uint64_t factorCount)

{
  unsigned_long *puVar1;
  undefined8 *puVar2;
  double *pdVar3;
  uint64_t factorCount_00;
  size_type __n;
  undefined1 auVar4 [16];
  double dVar5;
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong size_00;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint64_t k;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  pair<unsigned_long,_unsigned_long> *factors_00;
  complex<double> *pcVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> tmp;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_a8;
  undefined1 local_88 [24];
  long local_70;
  ulong local_68;
  pair<unsigned_long,_unsigned_long> *local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  if (size != 1) {
    __n = factors->first;
    puVar1 = &factors->second;
    *puVar1 = *puVar1 - 1;
    local_68 = (ulong)(*puVar1 == 0);
    local_70 = (ulong)(*puVar1 == 0) << 4;
    size_00 = size / __n;
    local_a8.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)local_a8.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
    local_60 = factors;
    std::vector<bool,_std::allocator<bool>_>::vector
              (&local_58,size,(bool *)&local_a8,(allocator_type *)local_88);
    *local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
     super__Bit_iterator_base._M_p =
         *local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p | 1;
    uVar10 = size - 1;
    uVar15 = size + 0x3e;
    if (-1 < (long)uVar10) {
      uVar15 = uVar10;
    }
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p
    [((long)uVar15 >> 6) + ((ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
         local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p
         [((long)uVar15 >> 6) + ((ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
         1L << ((byte)uVar10 & 0x3f);
    if (size != 0) {
      uVar15 = 0;
      do {
        uVar10 = uVar15 + 0x3f;
        if (-1 < (long)uVar15) {
          uVar10 = uVar15;
        }
        lVar9 = (long)uVar10 >> 6;
        uVar11 = (ulong)((uVar15 & 0x800000000000003f) < 0x8000000000000001);
        uVar17 = 1L << ((byte)uVar15 & 0x3f);
        uVar10 = local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [lVar9 + (uVar11 - 1)];
        if ((uVar10 >> (uVar15 & 0x3f) & 1) == 0) {
          do {
            local_a8.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_start = *(pointer *)beg[uVar15 * stride]._M_value;
            local_a8.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_finish = *(pointer *)(beg[uVar15 * stride]._M_value + 8);
            local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[lVar9 + (uVar11 - 1)] = uVar10 | uVar17;
            lVar12 = uVar15 * stride;
            uVar8 = (uVar15 % size_00) * __n + uVar15 / size_00;
            uVar10 = uVar15;
            while (uVar7 = uVar8, uVar7 != uVar15) {
              lVar12 = uVar7 * stride;
              uVar6 = *(undefined8 *)(beg[lVar12]._M_value + 8);
              *(undefined8 *)beg[uVar10 * stride]._M_value = *(undefined8 *)beg[lVar12]._M_value;
              *(undefined8 *)(beg[uVar10 * stride]._M_value + 8) = uVar6;
              uVar10 = uVar7 + 0x3f;
              if (-1 < (long)uVar7) {
                uVar10 = uVar7;
              }
              local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p
              [((long)uVar10 >> 6) +
               ((ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
                   local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [((long)uVar10 >> 6) +
                    ((ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
                   1L << ((byte)uVar7 & 0x3f);
              uVar10 = uVar7;
              uVar8 = (uVar7 % size_00) * __n + uVar7 / size_00;
            }
            *(pointer *)beg[lVar12]._M_value =
                 local_a8.
                 super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            *(pointer *)(beg[lVar12]._M_value + 8) =
                 local_a8.
                 super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            uVar10 = local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     [lVar9 + (uVar11 - 1)];
          } while ((uVar10 & uVar17) == 0);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != size);
    }
    factorCount_00 = factorCount - local_68;
    factors_00 = (pair<unsigned_long,_unsigned_long> *)((long)&local_60->first + local_70);
    lVar13 = size_00 * stride;
    lVar18 = __n + (__n == 0);
    lVar12 = 0;
    lVar9 = lVar18;
    do {
      cooleyTukey<std::complex<double>>
                (beg + lVar13 * lVar12,stride,base,baseStride * __n,size_00,factors_00,
                 factorCount_00);
      lVar12 = lVar12 + 1;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
    factors_00[(ulong)(factors_00->first == __n) - 1].second =
         factors_00[(ulong)(factors_00->first == __n) - 1].second + 1;
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
              (&local_a8,__n,(allocator_type *)local_88);
    if (__n <= size) {
      uVar15 = 0;
      do {
        lVar12 = 0;
        lVar9 = lVar18;
        do {
          uVar6 = *(undefined8 *)(beg->_M_value + 8);
          puVar2 = (undefined8 *)
                   ((long)(local_a8.
                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar12);
          *puVar2 = *(undefined8 *)beg->_M_value;
          puVar2[1] = uVar6;
          beg = beg + lVar13;
          lVar12 = lVar12 + 0x10;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
        pcVar16 = beg + -(__n * lVar13);
        lVar9 = 0;
        uVar10 = uVar15;
        do {
          *(undefined8 *)pcVar16->_M_value = 0;
          *(undefined8 *)(pcVar16->_M_value + 8) = 0;
          lVar19 = 0;
          lVar14 = 0;
          lVar12 = lVar18;
          do {
            pdVar3 = (double *)
                     ((long)(local_a8.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_value + lVar19);
            local_88._0_8_ = *pdVar3;
            local_88._8_8_ = pdVar3[1];
            std::complex<double>::operator*=
                      ((complex<double> *)local_88,
                       base + ((lVar14 * uVar10) % (size_00 * __n)) * ((baseStride * __n) / __n));
            dVar5 = *(double *)(pcVar16->_M_value + 8) + (double)local_88._8_8_;
            auVar4._8_4_ = SUB84(dVar5,0);
            auVar4._0_8_ = *(double *)pcVar16->_M_value + (double)local_88._0_8_;
            auVar4._12_4_ = (int)((ulong)dVar5 >> 0x20);
            *(undefined1 (*) [16])pcVar16->_M_value = auVar4;
            lVar14 = lVar14 + 1;
            lVar19 = lVar19 + 0x10;
            lVar12 = lVar12 + -1;
          } while (lVar12 != 0);
          lVar9 = lVar9 + 1;
          pcVar16 = pcVar16 + lVar13;
          uVar10 = uVar10 + size_00;
        } while (lVar9 != lVar18);
        uVar15 = uVar15 + 1;
        beg = pcVar16 + (stride - __n * lVar13);
      } while (uVar15 < size_00);
    }
    if (local_a8.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (ulong *)0x0) {
      operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
  }
  return;
}

Assistant:

constexpr void cooleyTukey(TValue* beg, uint64_t stride, const TValue* base, uint64_t baseStride, uint64_t size, std::pair<uint64_t, uint64_t>* factors, uint64_t factorCount)
		{
			if (size == 1)
			{
				return;
			}

			// TODO: https://en.wikipedia.org/wiki/Rader%27s_FFT_algorithm
			// if (factorCount == 1 && factors->second == 1)
			// {
			// }

			// Compute best radix and remove it from factors

			const uint64_t radix = factors->first;

			--factors->second;
			if (factors->second == 0)
			{
				++factors;
				--factorCount;
			}

			// Re-order elements according to radix

			const uint64_t subSize = size / radix;

			std::vector<bool> visited(size, false);
			visited[0] = true;
			visited[size - 1] = true;

			uint64_t n = 0;
			uint64_t preced, next;
			while (n != size)
			{
				if (visited[n])
				{
					++n;
					continue;
				}

				TValue tmp = *(beg + n * stride);
				visited[n] = true;

				preced = n;
				next = preced / subSize + (preced % subSize) * radix;

				while (next != n)
				{
					*(beg + preced * stride) = *(beg + next * stride);
					visited[next] = true;

					preced = next;
					next = preced / subSize + (preced % subSize) * radix;
				}

				*(beg + preced * stride) = tmp;
			}

			// Run algorithm on sub-ranges

			size = subSize;
			baseStride *= radix;

			for (uint64_t i = 0; i < radix; ++i)
			{
				cooleyTukey(beg + i * size * stride, stride, base, baseStride, size, factors, factorCount);
			}

			baseStride /= radix;
			const uint64_t realSize = size * radix;

			// Put back the factor

			if (factors->first != radix)
			{
				--factors;
				++factorCount;
			}
			++factors->second;

			// Merge sub-ranges

			const uint64_t rangeOffset = size * stride;
				
			std::vector<TValue> tmp(radix);
			TValue* it = beg;
			for (uint64_t i = 0; i < size; ++i, it += stride)
			{
				for (uint64_t j = 0; j < radix; ++j, it += rangeOffset)
				{
					tmp[j] = *it;
				}
				it -= radix * rangeOffset;

				uint64_t coeff = i;
				for (uint64_t j = 0; j < radix; ++j, it += rangeOffset, coeff += size)
				{
					*it = 0;
					for (uint64_t k = 0; k < radix; ++k)
					{
						*it += tmp[k] * *(base + ((k * coeff) % realSize) * baseStride);
					}
				}
				it -= radix * rangeOffset;
			}
		}